

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O0

void __thiscall
iDynTree::InverseKinematics::getFullJointsSolution
          (InverseKinematics *this,Transform *baseTransformSolution,VectorDynSize *shapeSolution)

{
  missingIpoptErrorReport();
  return;
}

Assistant:

void InverseKinematics::getFullJointsSolution(iDynTree::Transform & baseTransformSolution,
                                                  iDynTree::VectorDynSize & shapeSolution)
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        assert(shapeSolution.size() == IK_PIMPL(m_pimpl)->m_dofs);
        baseTransformSolution = IK_PIMPL(m_pimpl)->m_baseResults;
        shapeSolution         = IK_PIMPL(m_pimpl)->m_jointsResults;
#else
        missingIpoptErrorReport();
#endif
    }